

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_keyt.c
# Opt level: O2

err_t bignKeyWrap(octet *token,bign_params *params,octet *key,size_t len,octet *header,octet *pubkey
                 ,gen_i rng,void *rng_state)

{
  word *buf;
  octet *dest;
  size_t count;
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  ec_o *ec;
  word *stack;
  word *a;
  word *b;
  
  bVar1 = memIsValid(params,0x150);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else if (rng == (gen_i)0x0) {
      eVar2 = 0x130;
    }
    else if (((0xf < len) && (bVar1 = memIsValid(key,len), bVar1 != 0)) &&
            ((header == (octet *)0x0 || (bVar1 = memIsValid(header,0x10), bVar1 != 0)))) {
      sVar3 = bignStart_keep(params->l,bignKeyWrap_deep);
      ec = (ec_o *)blobCreate(sVar3);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bignStart(ec,params);
        if (eVar2 == 0) {
          sVar3 = ec->f->n;
          count = ec->f->no;
          bVar1 = memIsValid(pubkey,count * 2);
          eVar2 = 0x6d;
          if ((bVar1 != 0) && (bVar1 = memIsValid(token,len + count + 0x10), bVar1 != 0)) {
            a = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
            bVar1 = zzRandNZMod(a,ec->order,sVar3,rng,rng_state);
            if (bVar1 == 0) {
              eVar2 = 0x130;
            }
            else {
              b = a + sVar3;
              stack = b + sVar3 * 2 + 4;
              bVar1 = (*ec->f->from)(b,pubkey,ec->f,stack);
              eVar2 = 0x1f9;
              if (bVar1 != 0) {
                buf = b + sVar3;
                bVar1 = (*ec->f->from)(buf,pubkey + count,ec->f,stack);
                if (bVar1 != 0) {
                  bVar1 = ecMulA(b,b,ec,a,sVar3,stack);
                  eVar2 = 0x1f6;
                  if (bVar1 != 0) {
                    (*ec->f->to)((octet *)(b + sVar3 * 2),b,ec->f,stack);
                    bVar1 = ecMulA(b,ec->base,ec,a,sVar3,stack);
                    if (bVar1 != 0) {
                      (*ec->f->to)((octet *)b,b,ec->f,stack);
                      if (header == (octet *)0x0) {
                        memSet(buf,'\0',0x10);
                      }
                      else {
                        memCopy(buf,header,0x10);
                      }
                      dest = token + count;
                      memMove(dest,key,len);
                      memCopy(dest + len,buf,0x10);
                      beltWBLStart(stack,(octet *)(b + sVar3 * 2),0x20);
                      beltWBLStepE(dest,len + 0x10,stack);
                      memCopy(token,b,count);
                      eVar2 = 0;
                    }
                  }
                }
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignKeyWrap(octet token[], const bign_params* params, const octet key[],
	size_t len, const octet header[16], const octet pubkey[],
	gen_i rng, void* rng_state)
{
	err_t code;
	size_t no, n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	octet* theta;			/* [32] ключ защиты */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// проверить header и key
	if (len < 16 ||
		!memIsValid(key, len) ||
		!memIsNullOrValid(header, 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignKeyWrap_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(pubkey, 2 * no) ||
		!memIsValid(token, 16 + no + len))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	k = objEnd(ec, word);
	R = k + n;
	theta = (octet*)(R + 2 * n);
	stack = theta + 32;
	// сгенерировать k
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// R <- k Q
	if (!qrFrom(ecX(R), pubkey, ec->f, stack) ||
		!qrFrom(ecY(R, n), pubkey + no, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	if (!ecMulA(R, R, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// theta <- <R>_{256}
	qrTo(theta, ecX(R), ec->f, stack);
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// сформировать блок для шифрования
	// (буферы key, header и token могут пересекаться)
	if (header)
		memCopy(R + n, header, 16);
	else
		memSetZero(R + n, 16);
	memMove(token + no, key, len);
	memCopy(token + no + len, R + n, 16);
	// зашифровать
	beltKWPStart(stack, theta, 32);
	beltKWPStepE(token + no, len + 16, stack);
	// доопределить токен
	memCopy(token, R, no);
	// все нормально
	blobClose(state);
	return ERR_OK;
}